

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<char_const(&)[3],kj::Array<kj::StringTree>,char_const(&)[2]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [3],
          Array<kj::StringTree> *params_1,char (*params_2) [2])

{
  char (*value) [3];
  Array<kj::StringTree> *this_00;
  char (*value_00) [2];
  Array<kj::StringTree> *value_01;
  ArrayPtr<const_char> local_80;
  StringTree local_70;
  ArrayPtr<const_char> local_38;
  Array<kj::StringTree> *local_28;
  char (*params_local_2) [2];
  Array<kj::StringTree> *params_local_1;
  char (*params_local) [3];
  
  local_28 = params_1;
  params_local_2 = (char (*) [2])params;
  params_local_1 = (Array<kj::StringTree> *)this;
  params_local = (char (*) [3])__return_storage_ptr__;
  value = ::const((char (*) [3])this);
  local_38 = _::toStringTreeOrCharSequence<char_const(&)[3]>(value);
  this_00 = fwd<kj::Array<kj::StringTree>>((NoInfer<kj::Array<kj::StringTree>_> *)params_local_2);
  _::toStringTreeOrCharSequence<kj::Array<kj::StringTree>>(&local_70,(_ *)this_00,value_01);
  value_00 = ::const((char (*) [2])local_28);
  local_80 = _::toStringTreeOrCharSequence<char_const(&)[2]>(value_00);
  StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_38,(ArrayPtr<const_char> *)&local_70,
             (StringTree *)&local_80,(ArrayPtr<const_char> *)params_2);
  StringTree::~StringTree(&local_70);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}